

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O2

void i4_factor(int n,int maxfactor,int *nfactor,int *factor,int *power,int *nleft)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int n_00;
  
  *nfactor = 0;
  uVar4 = 0;
  uVar3 = 0;
  if (0 < maxfactor) {
    uVar3 = (ulong)(uint)maxfactor;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    factor[uVar4] = 0;
  }
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    power[uVar4] = 0;
  }
  *nleft = n;
  if (n != 0) {
    if ((n + 1U & 0xfffffffd) == 0) {
      *nfactor = 1;
      *factor = 1;
      *power = 1;
    }
    else {
      for (n_00 = 1; n_00 != 0x641; n_00 = n_00 + 1) {
        iVar1 = prime(n_00);
        iVar5 = *nleft;
        iVar2 = -iVar5;
        if (0 < iVar5) {
          iVar2 = iVar5;
        }
        if (iVar2 % iVar1 == 0) {
          iVar5 = *nfactor;
          if (iVar5 < maxfactor) {
            *nfactor = iVar5 + 1;
            factor[iVar5] = iVar1;
            do {
              power[(long)*nfactor + -1] = power[(long)*nfactor + -1] + 1;
              iVar2 = *nleft / iVar1;
              *nleft = iVar2;
              iVar5 = -iVar2;
              if (0 < iVar2) {
                iVar5 = iVar2;
              }
            } while (iVar5 % iVar1 == 0);
            if (iVar5 == 1) {
              return;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void i4_factor ( int n, int maxfactor, int &nfactor, int factor[], 
  int power[], int &nleft )

//****************************************************************************80
//
//  Purpose:
//
//    I4_FACTOR factors an integer into prime factors.
//
//  Discussion:
//
//    N = NLEFT * Product ( 1 <= I <= NFACTOR ) FACTOR(I)^POWER(I).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    14 February 2015
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the integer to be factored.  N may be positive,
//    negative, or 0.
//
//    Input, int MAXFACTOR, the maximum number of prime factors for
//    which storage has been allocated.
//
//    Output, int &NFACTOR, the number of prime factors of N discovered
//    by the routine.
//
//    Output, int FACTOR[MAXFACTOR], the prime factors of N.
//
//    Output, int POWER[MAXFACTOR].  POWER(I) is the power of
//    the FACTOR(I) in the representation of N.
//
//    Output, int &NLEFT, the factor of N that the routine could not
//    divide out.  If NLEFT is 1, then N has been completely factored.
//    Otherwise, NLEFT represents factors of N involving large primes.
//
{
  int i;
  int maxprime;
  int p;

  nfactor = 0;

  for ( i = 0; i < maxfactor; i++ )
  {
    factor[i] = 0;
  }

  for ( i = 0; i < maxfactor; i++ )
  {
    power[i] = 0;
  }

  nleft = n;

  if ( n == 0 )
  {
    return;
  }

  if ( abs ( n ) == 1 )
  {
    nfactor = 1;
    factor[0] = 1;
    power[0] = 1;
    return;
  }
//
//  Find out how many primes we stored.
//
  maxprime = prime ( -1 );
//
//  Try dividing the remainder by each prime.
//
  for ( i = 1; i <= maxprime; i++ )
  {
    p = prime ( i );

    if ( abs ( nleft ) % p == 0 )
    {
      if ( nfactor < maxfactor )
      {
        nfactor = nfactor + 1;
        factor[nfactor-1] = p;

        for ( ; ; )
        {
          power[nfactor-1] = power[nfactor-1] + 1;
          nleft = nleft / p;

          if ( abs ( nleft ) % p != 0 )
          {
            break;
          }

        }

        if ( abs ( nleft ) == 1 )
        {
          break;
        }
      }
    }
  }

  return;
}